

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_3537c6::Db::parseUnresolvedName(Db *this)

{
  short *psVar1;
  char *pcVar2;
  bool bVar3;
  Node *pNVar4;
  short *psVar5;
  Node *pNVar6;
  Node *pNVar7;
  bool bVar8;
  
  psVar5 = (short *)this->First;
  psVar1 = (short *)this->Last;
  if ((ulong)((long)psVar1 - (long)psVar5) < 3) {
    if ((long)psVar1 - (long)psVar5 != 2) {
      pNVar4 = parseBaseUnresolvedName(this);
      return pNVar4;
    }
LAB_0018e8f0:
    bVar8 = *psVar5 == 0x7367;
    if (bVar8) {
      psVar5 = psVar5 + 1;
      this->First = (char *)psVar5;
      bVar3 = true;
      if (1 < (ulong)((long)psVar1 - (long)psVar5)) goto LAB_0018e91a;
    }
    else {
LAB_0018e91a:
      bVar3 = bVar8;
      if (*psVar5 == 0x7273) {
        psVar5 = psVar5 + 1;
        this->First = (char *)psVar5;
        if ((psVar1 == psVar5) || (9 < (int)(char)*psVar5 - 0x30U)) {
          pNVar4 = parseUnresolvedType(this);
          if (pNVar4 != (Node *)0x0) {
            pNVar6 = pNVar4;
            if ((this->Last != this->First) && (*this->First == 'I')) {
              pNVar7 = parseTemplateArgs(this,false);
              if (pNVar7 == (Node *)0x0) {
                return (Node *)0x0;
              }
              pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
              pNVar6->K = KNameWithTemplateArgs;
              pNVar6->RHSComponentCache = No;
              pNVar6->ArrayCache = No;
              pNVar6->FunctionCache = No;
              pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4668;
              pNVar6[1]._vptr_Node = (_func_int **)pNVar4;
              *(Node **)&pNVar6[1].K = pNVar7;
            }
LAB_0018ebc1:
            pNVar4 = parseBaseUnresolvedName(this);
            if (pNVar4 != (Node *)0x0) {
              pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
              pNVar7->K = KQualifiedName;
              pNVar7->RHSComponentCache = No;
              pNVar7->ArrayCache = No;
              pNVar7->FunctionCache = No;
              pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3d20;
              pNVar7[1]._vptr_Node = (_func_int **)pNVar6;
              *(Node **)&pNVar7[1].K = pNVar4;
              return pNVar7;
            }
          }
        }
        else {
          pNVar4 = parseSimpleId(this);
          if (pNVar4 != (Node *)0x0) {
            pNVar6 = (Node *)0x0;
            do {
              if (pNVar6 == (Node *)0x0) {
                pNVar6 = pNVar4;
                if (bVar8) {
                  pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
                  pNVar7->K = KGlobalQualifiedName;
                  pNVar7->RHSComponentCache = No;
                  pNVar7->ArrayCache = No;
                  pNVar7->FunctionCache = No;
                  pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3e80;
                  pNVar6 = pNVar7 + 1;
                  goto LAB_0018eab2;
                }
              }
              else {
                pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
                pNVar7->K = KQualifiedName;
                pNVar7->RHSComponentCache = No;
                pNVar7->ArrayCache = No;
                pNVar7->FunctionCache = No;
                pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3d20;
                pNVar7[1]._vptr_Node = (_func_int **)pNVar6;
                pNVar6 = (Node *)&pNVar7[1].K;
LAB_0018eab2:
                pNVar6->_vptr_Node = (_func_int **)pNVar4;
                pNVar6 = pNVar7;
              }
              pcVar2 = this->First;
              if ((pcVar2 != this->Last) && (*pcVar2 == 'E')) {
                this->First = pcVar2 + 1;
                goto LAB_0018ebc1;
              }
              pNVar4 = parseSimpleId(this);
              if (pNVar4 == (Node *)0x0) {
                return (Node *)0x0;
              }
            } while( true );
          }
        }
        goto LAB_0018ec03;
      }
    }
    pNVar6 = parseBaseUnresolvedName(this);
    pNVar4 = pNVar6;
    if (bVar3 && pNVar6 != (Node *)0x0) {
      pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      pNVar4->K = KGlobalQualifiedName;
      pNVar4->RHSComponentCache = No;
      pNVar4->ArrayCache = No;
      pNVar4->FunctionCache = No;
      pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3e80;
      pNVar4[1]._vptr_Node = (_func_int **)pNVar6;
    }
  }
  else {
    if ((char)psVar5[1] != 'N' || *psVar5 != 0x7273) goto LAB_0018e8f0;
    this->First = (char *)((long)psVar5 + 3);
    pNVar4 = parseUnresolvedType(this);
    if (pNVar4 != (Node *)0x0) {
      pNVar6 = pNVar4;
      if ((this->Last != this->First) && (*this->First == 'I')) {
        pNVar7 = parseTemplateArgs(this,false);
        if (pNVar7 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar6->K = KNameWithTemplateArgs;
        pNVar6->RHSComponentCache = No;
        pNVar6->ArrayCache = No;
        pNVar6->FunctionCache = No;
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4668;
        pNVar6[1]._vptr_Node = (_func_int **)pNVar4;
        *(Node **)&pNVar6[1].K = pNVar7;
      }
      while ((pcVar2 = this->First, pcVar2 == this->Last || (*pcVar2 != 'E'))) {
        pNVar4 = parseSimpleId(this);
        if (pNVar4 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar7->K = KQualifiedName;
        pNVar7->RHSComponentCache = No;
        pNVar7->ArrayCache = No;
        pNVar7->FunctionCache = No;
        pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3d20;
        pNVar7[1]._vptr_Node = (_func_int **)pNVar6;
        *(Node **)&pNVar7[1].K = pNVar4;
        pNVar6 = pNVar7;
      }
      this->First = pcVar2 + 1;
      pNVar4 = parseBaseUnresolvedName(this);
      if (pNVar4 != (Node *)0x0) {
        pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar7->K = KQualifiedName;
        pNVar7->RHSComponentCache = No;
        pNVar7->ArrayCache = No;
        pNVar7->FunctionCache = No;
        pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3d20;
        pNVar7[1]._vptr_Node = (_func_int **)pNVar6;
        *(Node **)&pNVar7[1].K = pNVar4;
        return pNVar7;
      }
    }
LAB_0018ec03:
    pNVar4 = (Node *)0x0;
  }
  return pNVar4;
}

Assistant:

Node *Db::parseUnresolvedName() {
  Node *SoFar = nullptr;

  // srN <unresolved-type> [<template-args>] <unresolved-qualifier-level>* E <base-unresolved-name>
  // srN <unresolved-type>                   <unresolved-qualifier-level>+ E <base-unresolved-name>
  if (consumeIf("srN")) {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }

    while (!consumeIf('E')) {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      SoFar = make<QualifiedName>(SoFar, Qual);
    }

    Node *Base = parseBaseUnresolvedName();
    if (Base == nullptr)
      return nullptr;
    return make<QualifiedName>(SoFar, Base);
  }

  bool Global = consumeIf("gs");

  // [gs] <base-unresolved-name>                     # x or (with "gs") ::x
  if (!consumeIf("sr")) {
    SoFar = parseBaseUnresolvedName();
    if (SoFar == nullptr)
      return nullptr;
    if (Global)
      SoFar = make<GlobalQualifiedName>(SoFar);
    return SoFar;
  }

  // [gs] sr <unresolved-qualifier-level>+ E   <base-unresolved-name>
  if (std::isdigit(look())) {
    do {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      if (SoFar)
        SoFar = make<QualifiedName>(SoFar, Qual);
      else if (Global)
        SoFar = make<GlobalQualifiedName>(Qual);
      else
        SoFar = Qual;
    } while (!consumeIf('E'));
  }
  //      sr <unresolved-type>                 <base-unresolved-name>
  //      sr <unresolved-type> <template-args> <base-unresolved-name>
  else {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }
  }

  assert(SoFar != nullptr);

  Node *Base = parseBaseUnresolvedName();
  if (Base == nullptr)
    return nullptr;
  return make<QualifiedName>(SoFar, Base);
}